

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_Interval::Union(ON_Interval *this,int count,double *t)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  
  if (count < 1 || t == (double *)0x0) {
LAB_0057e2e7:
    if (0 < count && t != (double *)0x0) {
      dVar11 = this->m_t[0];
      dVar1 = this->m_t[1];
      uVar9 = SUB84(dVar1,0);
      uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
      bVar3 = dVar11 == -1.23432101234321e+308;
      if (bVar3 && dVar1 == -1.23432101234321e+308) {
        dVar11 = *t;
        uVar9 = SUB84(dVar11,0);
        uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
        t = t + 1;
        this->m_t[0] = dVar11;
        this->m_t[1] = dVar11;
        count = count + -1;
      }
      dVar5 = EmptyInterval.m_t[1];
      if (dVar11 <= (double)CONCAT44(uVar10,uVar9)) {
        if ((double)CONCAT44(uVar10,uVar9) <= dVar11) {
          uVar9 = SUB84(dVar11,0);
          uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
        }
      }
      else {
        uVar7 = -(ulong)(dVar11 < (double)CONCAT44(uVar10,uVar9));
        uVar4 = CONCAT44(uVar10,uVar9);
        dVar2 = ON_DBL_QNAN;
        if (!NAN(dVar11) && !NAN((double)CONCAT44(uVar10,uVar9))) {
          uVar8 = -(ulong)((double)CONCAT44(uVar10,uVar9) <= dVar11);
          dVar2 = (double)(~uVar8 & CONCAT44(uVar10,uVar9) | (ulong)dVar11 & uVar8);
        }
        uVar9 = SUB84(dVar2,0);
        uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
        dVar11 = (double)(~uVar7 & uVar4 | uVar7 & (ulong)ON_DBL_QNAN);
      }
      while (pdVar6 = t + 1, 0 < count) {
        dVar2 = *t;
        t = pdVar6;
        if (ABS(dVar2) < 1.23432101234321e+308) {
          if (dVar2 < dVar11) {
            count = count + -1;
            dVar11 = dVar2;
          }
          else {
            if (dVar2 < (double)CONCAT44(uVar10,uVar9) || dVar2 == (double)CONCAT44(uVar10,uVar9))
            goto LAB_0057e46b;
            count = count + -1;
            uVar9 = SUB84(dVar2,0);
            uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
          }
        }
        else {
LAB_0057e46b:
          count = count + -1;
        }
      }
      if ((((double)CONCAT44(uVar10,uVar9) < dVar11) || (1.23432101234321e+308 <= ABS(dVar11))) ||
         (1.23432101234321e+308 <= ABS((double)CONCAT44(uVar10,uVar9)))) {
        this->m_t[0] = EmptyInterval.m_t[0];
        this->m_t[1] = dVar5;
        return bVar3 && dVar1 == -1.23432101234321e+308;
      }
      goto LAB_0057e4f0;
    }
  }
  else {
    do {
      if (ABS(*t) < 1.23432101234321e+308) goto LAB_0057e2e7;
      t = t + 1;
      bVar3 = 1 < count;
      count = count + -1;
    } while (bVar3);
  }
  dVar11 = this->m_t[0];
  dVar1 = this->m_t[1];
  uVar9 = SUB84(dVar1,0);
  uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
  if (((dVar11 == -1.23432101234321e+308) && (!NAN(dVar11))) &&
     ((dVar1 == -1.23432101234321e+308 && (!NAN(dVar1))))) {
    return false;
  }
  if (dVar11 <= dVar1) {
    if (dVar1 <= dVar11) {
      uVar9 = SUB84(dVar11,0);
      uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
    }
  }
  else {
    dVar5 = ON_DBL_QNAN;
    if (!NAN(dVar11) && !NAN(dVar1)) {
      dVar5 = (double)(~-(ulong)(dVar1 <= dVar11) & (ulong)dVar1 |
                      (ulong)dVar11 & -(ulong)(dVar1 <= dVar11));
    }
    uVar9 = SUB84(dVar5,0);
    uVar10 = (undefined4)((ulong)dVar5 >> 0x20);
    dVar11 = (double)(~-(ulong)(dVar11 < dVar1) & (ulong)dVar1 |
                     -(ulong)(dVar11 < dVar1) & (ulong)ON_DBL_QNAN);
  }
  if ((double)CONCAT44(uVar10,uVar9) < dVar11) {
    return false;
  }
  if (1.23432101234321e+308 <= ABS(dVar11)) {
    return false;
  }
  if (1.23432101234321e+308 <= ABS((double)CONCAT44(uVar10,uVar9))) {
    return false;
  }
LAB_0057e4f0:
  this->m_t[0] = dVar11;
  this->m_t[1] = (double)CONCAT44(uVar10,uVar9);
  return true;
}

Assistant:

bool ON_Interval::Union(
  int count,
  const double* t
  )
{
  bool rc = false;
  double a, mn, mx;

  if ( 0 != t )
  {
    while ( count > 0 && !ON_IsValid(*t) )
    {
      count--;
      t++;
    }
  }

  if ( count <= 0 || 0 == t )
  {
    // this may be increasing, decreasing, or empty
    if ( !IsEmptyInterval() )
    {
      mn = Min();
      mx = Max();
      if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
      {
        Set( mn, mx );
        rc = true;
      }
    }
  }
  else 
  {
    if ( IsEmptyInterval() ) 
    {
      a = *t++;
      Set( a, a );
      count--;
      rc = true;
    }
    mn = Min();
    mx = Max();
    while( count > 0 )
    {
      count--;
      a = *t++;
      if ( ON_IsValid(a) )
      {
        if ( a < mn )
          mn = a;
        else if ( a > mx )
          mx = a;
      }
    }
    if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
    {
      Set(mn,mx);
      rc = true;
    }
    else
    {
      *this = ON_Interval::EmptyInterval;
    }
  }
  return rc;
}